

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O0

descriptor_state *
std::experimental::net::v1::detail::object_pool_access::
create<std::experimental::net::v1::detail::epoll_reactor::descriptor_state,bool>(bool arg)

{
  descriptor_state *pdVar1;
  bool in_stack_0000002f;
  descriptor_state *in_stack_00000030;
  
  pdVar1 = (descriptor_state *)operator_new(0xa8);
  webfront::http::std::experimental::net::v1::detail::epoll_reactor::descriptor_state::
  descriptor_state(in_stack_00000030,in_stack_0000002f);
  return pdVar1;
}

Assistant:

static Object* create(Arg arg)
  {
    return new Object(arg);
  }